

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NitfIsd.h
# Opt level: O1

void __thiscall csm::Tre::~Tre(Tre *this)

{
  if (*(Tre **)(this + 0x28) != this + 0x38) {
    operator_delete(*(Tre **)(this + 0x28),*(long *)(this + 0x38) + 1);
  }
  if (*(Tre **)this != this + 0x10) {
    operator_delete(*(Tre **)this,*(long *)(this + 0x10) + 1);
    return;
  }
  return;
}

Assistant:

~Tre() {}